

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O2

uint * Cec_ManSimSimRef(Cec_ManSim_t *p,int i)

{
  uint *puVar1;
  int *piVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  int iVar5;
  
  piVar2 = p->pSimInfo;
  if (piVar2[i] != 0) {
    __assert_fail("p->pSimInfo[i] == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecClass.c"
                  ,0x197,"unsigned int *Cec_ManSimSimRef(Cec_ManSim_t *, int)");
  }
  iVar4 = p->MemFree;
  if (iVar4 != 0) goto LAB_004b3cb0;
  iVar4 = p->nWordsAlloc;
  puVar1 = p->pMems;
  if ((long)iVar4 == 0) {
    if (puVar1 != (uint *)0x0) {
      __assert_fail("p->pMems == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecClass.c"
                    ,0x19c,"unsigned int *Cec_ManSimSimRef(Cec_ManSim_t *, int)");
    }
    p->nWordsAlloc = 0x40000;
    p->nMems = 1;
    iVar5 = 0x40000;
LAB_004b3c91:
    puVar1 = (uint *)malloc((long)iVar5 << 2);
  }
  else {
    iVar5 = iVar4 * 2;
    p->nWordsAlloc = iVar5;
    if (puVar1 == (uint *)0x0) goto LAB_004b3c91;
    puVar1 = (uint *)realloc(puVar1,(long)iVar4 << 3);
  }
  p->pMems = puVar1;
  Cec_ManSimMemRelink(p);
  iVar4 = p->MemFree;
  piVar2 = p->pSimInfo;
LAB_004b3cb0:
  piVar2[i] = iVar4;
  puVar1 = p->pMems + p->MemFree;
  p->MemFree = *puVar1;
  pGVar3 = Gia_ManObj(p->pAig,i);
  *puVar1 = pGVar3->Value;
  iVar5 = p->nMems;
  iVar4 = iVar5 + 1;
  p->nMems = iVar4;
  if (p->nMemsMax <= iVar5) {
    p->nMemsMax = iVar4;
  }
  return puVar1;
}

Assistant:

unsigned * Cec_ManSimSimRef( Cec_ManSim_t * p, int i )
{
    unsigned * pSim;
    assert( p->pSimInfo[i] == 0 );
    if ( p->MemFree == 0 )
    {
        if ( p->nWordsAlloc == 0 )
        {
            assert( p->pMems == NULL );
            p->nWordsAlloc = (1<<17); // -> 1Mb
            p->nMems = 1;
        }
        p->nWordsAlloc *= 2;
        p->pMems = ABC_REALLOC( unsigned, p->pMems, p->nWordsAlloc );
        Cec_ManSimMemRelink( p );
    }
    p->pSimInfo[i] = p->MemFree;
    pSim = p->pMems + p->MemFree;
    p->MemFree = pSim[0];
    pSim[0] = Gia_ObjValue( Gia_ManObj(p->pAig, i) );
    p->nMems++;
    if ( p->nMemsMax < p->nMems )
        p->nMemsMax = p->nMems;
    return pSim;
}